

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O1

CURLdigest Curl_input_digest(connectdata *conn,_Bool proxy,char *header)

{
  byte bVar1;
  SessionHandle *pSVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ushort **ppuVar8;
  long lVar9;
  char *pcVar10;
  char *first;
  bool bVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte bVar15;
  undefined7 in_register_00000031;
  byte bVar16;
  uint uVar17;
  digestdata *d;
  bool bVar18;
  char *tok_buf;
  char value [256];
  char content [1024];
  CURLdigest local_558;
  char *local_540;
  byte local_538 [256];
  byte local_438 [1032];
  
  pSVar2 = conn->data;
  iVar6 = Curl_raw_nequal("Digest",header,6);
  if (iVar6 == 0) {
    local_558 = CURLDIGEST_NONE;
  }
  else {
    uVar17 = (int)CONCAT71(in_register_00000031,proxy) << 6;
    d = (digestdata *)((long)&(pSVar2->state).digest.nonce + (ulong)uVar17);
    pbVar14 = (byte *)(header + 6);
    pcVar3 = d->nonce;
    digest_cleanup_one(d);
    bVar5 = false;
    bVar11 = false;
    do {
      bVar15 = *pbVar14;
      if (bVar15 != 0) {
        ppuVar8 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar8 + (ulong)bVar15 * 2 + 1) & 0x20) == 0) break;
          bVar15 = pbVar14[1];
          pbVar14 = pbVar14 + 1;
        } while (bVar15 != 0);
      }
      lVar9 = 0;
      pbVar13 = pbVar14;
      while( true ) {
        pbVar12 = pbVar13 + 1;
        bVar15 = *pbVar13;
        if (((bVar15 == 0) || (bVar15 == 0x3d)) || ((int)lVar9 == 0xff)) break;
        local_538[lVar9] = bVar15;
        lVar9 = lVar9 + 1;
        pbVar13 = pbVar12;
      }
      local_538[lVar9] = 0;
      bVar15 = *pbVar13;
      if (bVar15 == 0x3d) {
        bVar1 = *pbVar12;
        pbVar14 = pbVar13 + 2;
        if (bVar1 != 0x22) {
          pbVar14 = pbVar12;
        }
        bVar16 = *pbVar14;
        pbVar13 = local_438;
        if (bVar16 != 0) {
          iVar6 = 0x3ff;
          bVar4 = false;
          do {
            bVar18 = iVar6 == 0;
            iVar6 = iVar6 + -1;
            if (bVar18) break;
            if (bVar16 < 0x22) {
              if ((bVar16 != 10) && (bVar16 != 0xd)) goto LAB_0056a730;
LAB_0056a719:
              iVar6 = 0;
            }
            else {
              if (bVar16 == 0x22) {
                if ((bool)(bVar1 == 0x22 & (bVar4 ^ 1U))) goto LAB_0056a719;
LAB_0056a730:
                bVar4 = false;
              }
              else {
                if (bVar16 == 0x2c) {
                  if (bVar1 != 0x22) goto LAB_0056a719;
                  goto LAB_0056a730;
                }
                if ((bVar16 != 0x5c) || (bVar4)) goto LAB_0056a730;
                bVar4 = true;
                bVar16 = 0x5c;
              }
              *pbVar13 = bVar16;
              pbVar13 = pbVar13 + 1;
            }
            bVar16 = pbVar14[1];
            pbVar14 = pbVar14 + 1;
          } while (bVar16 != 0);
        }
        *pbVar13 = 0;
      }
      iVar6 = 2;
      if (bVar15 == 0x3d) {
        iVar6 = Curl_raw_equal((char *)local_538,"nonce");
        if (iVar6 != 0) {
          pcVar10 = (*Curl_cstrdup)((char *)local_438);
          d->nonce = pcVar10;
          goto LAB_0056a783;
        }
        iVar6 = Curl_raw_equal((char *)local_538,"stale");
        if (iVar6 != 0) {
          iVar6 = Curl_raw_equal((char *)local_438,"true");
          if (iVar6 != 0) {
            (&(pSVar2->state).digest.stale)[uVar17] = true;
            *(undefined4 *)((long)&(pSVar2->state).digest.nc + (ulong)uVar17) = 1;
          }
          goto LAB_0056a7ca;
        }
        iVar6 = Curl_raw_equal((char *)local_538,"realm");
        if (iVar6 == 0) {
          iVar6 = Curl_raw_equal((char *)local_538,"opaque");
          if (iVar6 != 0) {
            pcVar10 = (*Curl_cstrdup)((char *)local_438);
            *(char **)((long)&(pSVar2->state).digest.opaque + (ulong)uVar17) = pcVar10;
            goto LAB_0056a783;
          }
          iVar6 = Curl_raw_equal((char *)local_538,"qop");
          if (iVar6 != 0) {
            pcVar10 = (*Curl_cstrdup)((char *)local_438);
            if (pcVar10 == (char *)0x0) {
LAB_0056a99c:
              bVar4 = false;
              local_558 = CURLDIGEST_NOMEM;
            }
            else {
              first = strtok_r(pcVar10,",",&local_540);
              while (first != (char *)0x0) {
                iVar6 = Curl_raw_equal(first,"auth");
                if (iVar6 == 0) {
                  iVar6 = Curl_raw_equal(first,"auth-int");
                  if (iVar6 != 0) {
                    bVar11 = true;
                  }
                }
                else {
                  bVar5 = true;
                }
                first = strtok_r((char *)0x0,",",&local_540);
              }
              (*Curl_cfree)(pcVar10);
              if (bVar5) {
                pcVar10 = "auth";
LAB_0056a986:
                pcVar10 = (*Curl_cstrdup)(pcVar10);
                *(char **)((long)&(pSVar2->state).digest.qop + (ulong)uVar17) = pcVar10;
                if (pcVar10 == (char *)0x0) goto LAB_0056a99c;
              }
              else if (bVar11) {
                pcVar10 = "auth-int";
                goto LAB_0056a986;
              }
              bVar4 = true;
            }
            iVar6 = 1;
            if (!bVar4) goto LAB_0056a802;
            goto LAB_0056a7ca;
          }
          iVar6 = Curl_raw_equal((char *)local_538,"algorithm");
          if (iVar6 == 0) goto LAB_0056a7ca;
          pcVar10 = (*Curl_cstrdup)((char *)local_438);
          *(char **)((long)&(pSVar2->state).digest.algorithm + (ulong)uVar17) = pcVar10;
          iVar6 = 1;
          if (pcVar10 != (char *)0x0) {
            iVar7 = Curl_raw_equal((char *)local_438,"MD5-sess");
            if (iVar7 == 0) {
              iVar7 = Curl_raw_equal((char *)local_438,"MD5");
              if (iVar7 == 0) {
                local_558 = CURLDIGEST_BADALGO;
                goto LAB_0056a802;
              }
              *(undefined4 *)((long)&(pSVar2->state).digest.algo + (ulong)uVar17) = 0;
            }
            else {
              *(undefined4 *)((long)&(pSVar2->state).digest.algo + (ulong)uVar17) = 1;
            }
            goto LAB_0056a7ca;
          }
        }
        else {
          pcVar10 = (*Curl_cstrdup)((char *)local_438);
          *(char **)((long)&(pSVar2->state).digest.realm + (ulong)uVar17) = pcVar10;
LAB_0056a783:
          if (pcVar10 != (char *)0x0) {
LAB_0056a7ca:
            bVar15 = *pbVar14;
            iVar6 = 0;
            if (bVar15 != 0) {
              ppuVar8 = __ctype_b_loc();
              do {
                if ((*(byte *)((long)*ppuVar8 + (ulong)bVar15 * 2 + 1) & 0x20) == 0) {
                  pbVar14 = pbVar14 + (bVar15 == 0x2c);
                  break;
                }
                bVar15 = pbVar14[1];
                pbVar14 = pbVar14 + 1;
              } while (bVar15 != 0);
            }
            goto LAB_0056a802;
          }
        }
        iVar6 = 1;
        local_558 = CURLDIGEST_NOMEM;
      }
LAB_0056a802:
    } while (iVar6 == 0);
    if ((iVar6 == 2) &&
       ((pcVar3 == (char *)0x0 ||
        (local_558 = CURLDIGEST_BAD, (&(pSVar2->state).digest.stale)[uVar17] == true)))) {
      local_558 = (uint)(d->nonce != (char *)0x0) * 3 + CURLDIGEST_BAD;
    }
  }
  return local_558;
}

Assistant:

CURLdigest Curl_input_digest(struct connectdata *conn,
                             bool proxy,
                             const char *header) /* rest of the *-authenticate:
                                                    header */
{
  char *token = NULL;
  char *tmp = NULL;
  bool foundAuth = FALSE;
  bool foundAuthInt = FALSE;
  struct SessionHandle *data=conn->data;
  bool before = FALSE; /* got a nonce before */
  struct digestdata *d;

  if(proxy) {
    d = &data->state.proxydigest;
  }
  else {
    d = &data->state.digest;
  }

  if(checkprefix("Digest", header)) {
    header += strlen("Digest");

    /* If we already have received a nonce, keep that in mind */
    if(d->nonce)
      before = TRUE;

    /* clear off any former leftovers and init to defaults */
    digest_cleanup_one(d);

    for(;;) {
      char value[MAX_VALUE_LENGTH];
      char content[MAX_CONTENT_LENGTH];

      while(*header && ISSPACE(*header))
        header++;

      /* extract a value=content pair */
      if(!get_pair(header, value, content, &header)) {
        if(Curl_raw_equal(value, "nonce")) {
          d->nonce = strdup(content);
          if(!d->nonce)
            return CURLDIGEST_NOMEM;
        }
        else if(Curl_raw_equal(value, "stale")) {
          if(Curl_raw_equal(content, "true")) {
            d->stale = TRUE;
            d->nc = 1; /* we make a new nonce now */
          }
        }
        else if(Curl_raw_equal(value, "realm")) {
          d->realm = strdup(content);
          if(!d->realm)
            return CURLDIGEST_NOMEM;
        }
        else if(Curl_raw_equal(value, "opaque")) {
          d->opaque = strdup(content);
          if(!d->opaque)
            return CURLDIGEST_NOMEM;
        }
        else if(Curl_raw_equal(value, "qop")) {
          char *tok_buf;
          /* tokenize the list and choose auth if possible, use a temporary
             clone of the buffer since strtok_r() ruins it */
          tmp = strdup(content);
          if(!tmp)
            return CURLDIGEST_NOMEM;
          token = strtok_r(tmp, ",", &tok_buf);
          while(token != NULL) {
            if(Curl_raw_equal(token, "auth")) {
              foundAuth = TRUE;
            }
            else if(Curl_raw_equal(token, "auth-int")) {
              foundAuthInt = TRUE;
            }
            token = strtok_r(NULL, ",", &tok_buf);
          }
          free(tmp);
          /*select only auth o auth-int. Otherwise, ignore*/
          if(foundAuth) {
            d->qop = strdup("auth");
            if(!d->qop)
              return CURLDIGEST_NOMEM;
          }
          else if(foundAuthInt) {
            d->qop = strdup("auth-int");
            if(!d->qop)
              return CURLDIGEST_NOMEM;
          }
        }
        else if(Curl_raw_equal(value, "algorithm")) {
          d->algorithm = strdup(content);
          if(!d->algorithm)
            return CURLDIGEST_NOMEM;
          if(Curl_raw_equal(content, "MD5-sess"))
            d->algo = CURLDIGESTALGO_MD5SESS;
          else if(Curl_raw_equal(content, "MD5"))
            d->algo = CURLDIGESTALGO_MD5;
          else
            return CURLDIGEST_BADALGO;
        }
        else {
          /* unknown specifier, ignore it! */
        }
      }
      else
        break; /* we're done here */

      /* pass all additional spaces here */
      while(*header && ISSPACE(*header))
        header++;
      if(',' == *header)
        /* allow the list to be comma-separated */
        header++;
    }
    /* We had a nonce since before, and we got another one now without
       'stale=true'. This means we provided bad credentials in the previous
       request */
    if(before && !d->stale)
      return CURLDIGEST_BAD;

    /* We got this header without a nonce, that's a bad Digest line! */
    if(!d->nonce)
      return CURLDIGEST_BAD;
  }
  else
    /* else not a digest, get out */
    return CURLDIGEST_NONE;

  return CURLDIGEST_FINE;
}